

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tls.c
# Opt level: O1

void * task_func(void *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  
  piVar1 = (int *)tp_get_tls();
  iVar2 = *piVar1;
  iVar3 = 3;
  do {
    iVar2 = iVar2 * 2 + 2;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  *piVar1 = iVar2;
  sleep(1);
  return (void *)0x0;
}

Assistant:

void *task_func(void *args)
{
    int i;
    thread_local_t *tls = args;

    int *data = tp_get_tls(tls);

    for (i = 0; i < 3; ++i) {
        *data += 2 + *data;
//        fprintf(stderr, "[%lu] %d\n", pthread_self(), *data);
    }

    sleep(1);

    return NULL;
}